

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppq.cpp
# Opt level: O1

void __thiscall pg::PPQSolver::solve(PPQSolver *this,int vtop,int pr,int prc,int pe,int po)

{
  ulong *puVar1;
  bitset *this_00;
  bitset *L;
  bitset *Z;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  uint *puVar7;
  int *piVar8;
  int *piVar9;
  Game *pGVar10;
  int *piVar11;
  uint64_t uVar12;
  uint64_t *__s;
  char cVar13;
  bool bVar14;
  ostream *poVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  long *plVar19;
  long lVar20;
  size_t sVar21;
  long lVar22;
  int pe_00;
  int iVar23;
  int iVar24;
  ulong uVar25;
  uint pl;
  _label_vertex local_60;
  void *local_50;
  int local_44;
  _label_vertex local_40;
  
  this->iterations = this->iterations + 1;
  if (pe != 0 && po != 0) {
    uVar25 = (ulong)(uint)vtop;
    if (-1 < vtop) {
      uVar25 = (ulong)(uint)vtop;
      do {
        if (((((this->G)._bits[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0) && (this->r[uVar25] <= pr)
            ) && (this->u[uVar25] <= pr)) goto LAB_00157e6b;
        bVar14 = 0 < (long)uVar25;
        uVar25 = uVar25 - 1;
      } while (bVar14);
      uVar25 = 0xffffffff;
    }
LAB_00157e6b:
    iVar24 = (int)uVar25;
    if (iVar24 != -1) {
      if ((pr & 1U) == 0) {
        iVar23 = po / 2;
        pe_00 = pe;
      }
      else {
        pe_00 = pe / 2;
        iVar23 = po;
      }
      solve(this,iVar24,pr,prc,pe_00,iVar23);
      if (1 < (this->super_Solver).trace) {
        poVar15 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"in pr=",6);
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,pr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,", pe=",5);
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,pe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,", po=",5);
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,po);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," (caller pr=",0xc);
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,prc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,")",1);
        std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
      }
      if (-1 < iVar24) {
        uVar25 = uVar25 & 0xffffffff;
        do {
          if (((((this->G)._bits[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0) &&
              (this->r[uVar25] <= pr)) && (this->u[uVar25] <= pr)) goto LAB_00157fd9;
          bVar14 = 0 < (long)uVar25;
          uVar25 = uVar25 - 1;
        } while (bVar14);
        uVar25 = 0xffffffff;
      }
LAB_00157fd9:
      iVar24 = (int)uVar25;
      if (iVar24 != -1) {
        puVar5 = (this->R)._bits;
        sVar17 = (this->R)._bitssize;
        local_44 = prc;
        if (sVar17 != 0) {
          memset(puVar5,0,sVar17 << 3);
        }
        puVar6 = (this->L)._bits;
        sVar17 = (this->L)._bitssize;
        if (sVar17 != 0) {
          memset(puVar6,0,sVar17 << 3);
        }
        uVar16 = uVar25 & 0xffffffff;
        if (-1 < iVar24) {
          puVar7 = (this->Q).queue;
          piVar8 = this->r;
          uVar18 = uVar16;
          do {
            iVar23 = piVar8[uVar18];
            if (iVar23 != -1) {
              if (iVar23 == pr) {
                puVar1 = puVar5 + (uVar18 >> 6);
                *puVar1 = *puVar1 | 1L << (uVar18 & 0x3f);
                iVar23 = (this->Q).pointer;
                (this->Q).pointer = iVar23 + 1;
                puVar7[iVar23] = (uint)uVar18;
              }
              if (piVar8[uVar18] <= pr) {
                puVar1 = puVar6 + (uVar18 >> 6);
                *puVar1 = *puVar1 | 1L << (uVar18 & 0x3f);
              }
            }
            bVar14 = 0 < (long)uVar18;
            uVar18 = uVar18 - 1;
          } while (bVar14);
        }
        pl = pr & 1;
        this_00 = &this->R;
        L = &this->L;
        while (iVar23 = (this->Q).pointer, iVar23 != 0) {
          (this->Q).pointer = iVar23 + -1;
          uVar2 = (this->Q).queue[(long)iVar23 + -1];
          this->r[(int)uVar2] = pr;
          attractVertices(this,pl,uVar2,this_00,L,L);
        }
        if (1 < (this->super_Solver).trace) {
          poVar15 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"\x1b[1;33mregion \x1b[36m",0x13);
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,pr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\x1b[m",3);
          sVar17 = (this->R)._bitssize;
          sVar21 = 0xffffffffffffffff;
          if (sVar17 != 0) {
            lVar20 = sVar17 * -0x40;
            do {
              lVar20 = lVar20 + 0x40;
              if (this_00->_bits[sVar17 - 1] != 0) {
                sVar21 = LZCOUNT(this_00->_bits[sVar17 - 1]) - lVar20 ^ 0x3f;
                break;
              }
              sVar17 = sVar17 - 1;
            } while (sVar17 != 0);
          }
          for (; sVar21 != 0xffffffffffffffff; sVar21 = bitset::find_prev(this_00,sVar21)) {
            poVar15 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," \x1b[38;5;38m",0xb);
            local_60.g = (this->super_Solver).game;
            local_60.v = (int)sVar21;
            poVar15 = operator<<(poVar15,&local_60);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\x1b[m",3);
          }
          poVar15 = (this->super_Solver).logger;
          cVar13 = (char)poVar15;
          std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + cVar13);
          std::ostream::put(cVar13);
          std::ostream::flush();
        }
        bVar14 = maybePromote(this,pr,pl,this_00,L);
        if (!bVar14) {
          uVar18 = (this->R)._bitssize;
          local_50 = operator_new__(-(ulong)(uVar18 >> 0x3d != 0) | uVar18 * 8);
          if (uVar18 != 0) {
            memmove(local_50,this_00->_bits,uVar18 * 8);
          }
          uVar18 = uVar25 & 0xffffffff;
          if (-1 < iVar24) {
            uVar18 = uVar16;
            do {
              if (((((this->G)._bits[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0) &&
                  (this->r[uVar18] < pr)) && (this->u[uVar18] < pr)) goto LAB_001582e6;
              bVar14 = 0 < (long)uVar18;
              uVar18 = uVar18 - 1;
            } while (bVar14);
            uVar18 = 0xffffffff;
          }
LAB_001582e6:
          if ((int)uVar18 != -1) {
            uVar3 = this->r[(int)uVar18];
            solve(this,iVar24,uVar3,pr,pe,po);
            if (1 < (this->super_Solver).trace) {
              poVar15 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,"back from recursive ",0x14);
              poVar15 = (ostream *)std::ostream::operator<<(poVar15,uVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,", we are pr ",0xc);
              poVar15 = (ostream *)std::ostream::operator<<(poVar15,pr);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,", pe=",5);
              poVar15 = (ostream *)std::ostream::operator<<(poVar15,pe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,", po=",5);
              plVar19 = (long *)std::ostream::operator<<(poVar15,po);
              std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
              std::ostream::put((char)plVar19);
              std::ostream::flush();
            }
            if (-1 < iVar24) {
              piVar8 = this->u;
              piVar9 = this->r;
              pGVar10 = (this->super_Solver).game;
              piVar11 = this->str;
              lVar20 = uVar16 + 1;
              do {
                uVar4 = piVar8[lVar20 + -1];
                if ((int)uVar4 < pr && uVar4 != 0xffffffff) {
                  if ((uVar4 & 1) == pl) {
LAB_00158467:
                    piVar8[lVar20 + -1] = pr;
                  }
                  else {
                    piVar8[lVar20 + -1] = -1;
                    piVar9[lVar20 + -1] = pGVar10->_priority[lVar20 + -1];
                    piVar11[lVar20 + -1] = -1;
                  }
                }
                else if (((uVar3 & 1) != pl) &&
                        (piVar9[lVar20 + -1] < pr && piVar9[lVar20 + -1] != -1)) {
                  piVar9[lVar20 + -1] = -1;
                  goto LAB_00158467;
                }
                lVar22 = lVar20 + -1;
                bVar14 = 0 < lVar20;
                lVar20 = lVar22;
              } while (lVar22 != 0 && bVar14);
            }
            if (1 < (this->super_Solver).trace) {
              poVar15 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,"\x1b[1mstate after Und\x1b[m",0x16);
              std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
              std::ostream::put((char)poVar15);
              std::ostream::flush();
              sVar17 = (this->G)._bitssize;
              sVar21 = 0xffffffffffffffff;
              if (sVar17 != 0) {
                lVar20 = sVar17 * -0x40;
                do {
                  lVar20 = lVar20 + 0x40;
                  uVar12 = (this->G)._bits[sVar17 - 1];
                  if (uVar12 != 0) {
                    sVar21 = LZCOUNT(uVar12) - lVar20 ^ 0x3f;
                    break;
                  }
                  sVar17 = sVar17 - 1;
                } while (sVar17 != 0);
              }
              for (; sVar21 != 0xffffffffffffffff; sVar21 = bitset::find_prev(&this->G,sVar21)) {
                local_60.g = (this->super_Solver).game;
                local_60.v = (int)sVar21;
                poVar15 = operator<<((this->super_Solver).logger,&local_60);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," r=",3);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->r[sVar21]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," u=",3);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,this->u[sVar21]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," str=",5);
                local_40.g = (this->super_Solver).game;
                local_40.v = this->str[sVar21];
                poVar15 = operator<<(poVar15,&local_40);
                std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
                std::ostream::put((char)poVar15);
                std::ostream::flush();
              }
            }
            puVar5 = (this->R)._bits;
            sVar17 = (this->R)._bitssize;
            if (sVar17 != 0) {
              memset(puVar5,0,sVar17 << 3);
            }
            puVar6 = (this->L)._bits;
            sVar17 = (this->L)._bitssize;
            if (sVar17 != 0) {
              memset(puVar6,0,sVar17 << 3);
            }
            __s = (this->U)._bits;
            sVar17 = (this->U)._bitssize;
            if (sVar17 != 0) {
              memset(__s,0,sVar17 << 3);
            }
            if (-1 < iVar24) {
              puVar7 = (this->Q).queue;
              piVar8 = this->r;
              piVar9 = this->u;
              uVar18 = uVar16;
              do {
                iVar23 = piVar8[uVar18];
                if (iVar23 == pr) {
                  puVar1 = puVar5 + (uVar18 >> 6);
                  *puVar1 = *puVar1 | 1L << (uVar18 & 0x3f);
                }
                if (iVar23 <= pr && iVar23 != -1) {
                  puVar1 = puVar6 + (uVar18 >> 6);
                  *puVar1 = *puVar1 | 1L << (uVar18 & 0x3f);
                }
                if (piVar9[uVar18] == pr) {
                  puVar1 = __s + (uVar18 >> 6);
                  *puVar1 = *puVar1 | 1L << (uVar18 & 0x3f);
                  iVar23 = (this->Q).pointer;
                  (this->Q).pointer = iVar23 + 1;
                  puVar7[iVar23] = (uint)uVar18;
                }
                bVar14 = 0 < (long)uVar18;
                uVar18 = uVar18 - 1;
              } while (bVar14);
            }
            Z = &this->U;
            while( true ) {
              iVar23 = (this->Q).pointer;
              if ((long)iVar23 == 0) break;
              (this->Q).pointer = iVar23 + -1;
              uVar2 = (this->Q).queue[(long)iVar23 + -1];
              this->u[(int)uVar2] = pr;
              this->r[(int)uVar2] = -1;
              attractVertices(this,pl ^ 1,uVar2,Z,L,L);
            }
            sVar17 = (this->R)._bitssize;
            if (sVar17 != 0) {
              puVar5 = Z->_bits;
              puVar6 = this_00->_bits;
              sVar21 = 0;
              do {
                puVar6[sVar21] = puVar6[sVar21] & ~puVar5[sVar21];
                sVar21 = sVar21 + 1;
              } while (sVar17 != sVar21);
            }
            sVar17 = (this->L)._bitssize;
            if (sVar17 != 0) {
              puVar5 = Z->_bits;
              puVar6 = L->_bits;
              sVar21 = 0;
              do {
                puVar6[sVar21] = puVar6[sVar21] & ~puVar5[sVar21];
                sVar21 = sVar21 + 1;
              } while (sVar17 != sVar21);
            }
            sVar17 = (this->R)._bitssize;
            if (sVar17 != 0) {
              puVar5 = this_00->_bits;
              sVar21 = 0;
              do {
                puVar5[sVar21] = puVar5[sVar21] | *(ulong *)((long)local_50 + sVar21 * 8);
                sVar21 = sVar21 + 1;
              } while (sVar17 != sVar21);
            }
            sVar17 = bitset::find_first(this_00);
            if (sVar17 != 0xffffffffffffffff) {
LAB_001587f6:
              uVar3 = this->r[sVar17];
              if (((uVar3 != 0xffffffff) && ((int)uVar3 <= pr || (uVar3 & 1) == pl)) &&
                 (((long)this->str[sVar17] == -1 || (this->r[this->str[sVar17]] == pr))))
              goto LAB_0015882e;
              uVar18 = uVar16;
              if (-1 < iVar24) {
                do {
                  if (this->r[uVar18] <= pr && this->r[uVar18] != -1) {
                    if (1 < (this->super_Solver).trace) {
                      poVar15 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"reset ",6);
                      local_60.g = (this->super_Solver).game;
                      local_60.v = (int)uVar18;
                      poVar15 = operator<<(poVar15,&local_60);
                      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
                      std::ostream::put((char)poVar15);
                      std::ostream::flush();
                    }
                    this->r[uVar18] = ((this->super_Solver).game)->_priority[uVar18];
                    this->u[uVar18] = -1;
                    this->str[uVar18] = -1;
                  }
                  bVar14 = 0 < (long)uVar18;
                  uVar18 = uVar18 - 1;
                } while (bVar14);
              }
              if (-1 < iVar24) {
                uVar25 = uVar16;
                do {
                  if (((((this->G)._bits[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0) &&
                      (this->r[uVar25] <= pr)) && (this->u[uVar25] <= pr)) goto LAB_0015898d;
                  bVar14 = 0 < (long)uVar25;
                  uVar25 = uVar25 - 1;
                } while (bVar14);
                uVar25 = 0xffffffff;
              }
LAB_0015898d:
              if ((int)uVar25 != -1) {
                if (pl == 0) {
                  po = po / 2;
                }
                else {
                  pe = pe / 2;
                }
                solve(this,(int)uVar25,pr,local_44,pe,po);
              }
              goto LAB_001589c4;
            }
LAB_0015883f:
            maybePromote(this,pr,pl,this_00,L);
          }
LAB_001589c4:
          operator_delete__(local_50);
        }
      }
    }
  }
  return;
LAB_0015882e:
  sVar17 = bitset::find_next(this_00,sVar17);
  if (sVar17 == 0xffffffffffffffff) goto LAB_0015883f;
  goto LAB_001587f6;
}

Assistant:

void
PPQSolver::solve(int vtop, const int pr, const int prc, const int pe, const int po)
{
    // track the number of visits
    iterations++;

    // no state change
    if (po == 0 || pe == 0) return;

    // move vtop to the true top, then check for game emptiness
    while (vtop >= 0 and (!G[vtop] or r[vtop] > pr or u[vtop] > pr)) vtop--;
    if (vtop == -1) return; // empty game, bye

    // const int pr = r[vtop]; // set to highest priority
    const int pl = pr&1;

    // Expand the left side of the current level of the universal tree
    // This is where we use Lehtinen's version, not Pawel's.
    if (pl == 0) solve(vtop, pr, prc, pe, po/2);
    else solve(vtop, pr, prc, pe/2, po);

#ifndef NDEBUG
    if (trace >= 2) logger << "in pr=" << pr << ", pe=" << pe << ", po=" << po << " (caller pr=" << prc << ")" << std::endl;
#endif

    // after the left side, a lot can be changed, find our new vtop

    while (vtop >= 0 and (!G[vtop] or r[vtop] > pr or u[vtop] > pr)) vtop--;
    if (vtop == -1) return; // empty game, bye

    // TODO handle some special cases: entire region in u; nothing left in r; L is smaller than pe/po

    // set R := all vertices with r[v] == pr
    // set L := all vertices with r[v] <= pr and r[v] != -1
    // also add each vertex in R to the attract queue Q

    R.reset();
    L.reset();
    for (int v = vtop; v >= 0; v--) {
        // assumption: if v not in G, then r[v] == -1
        if (r[v] != -1) {
            if (r[v] == pr) {
                R[v] = true; // add to R
                Q.push(v);   // add to Q
            } 
            if (r[v] <= pr) {
                L[v] = true; // add to L
            }
        }
    } 

    // Attract for pl from L to R

    while (Q.nonempty()) {
        int v = Q.pop();
        r[v] = pr;    // set r ; we already know/assume that u[v] == -1
        // L[v] = false; // remove from L
        attractVertices(pl, v, R, L, L);
    }

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[1;33mregion \033[36m" << pr << "\033[m";
        for (auto v = R.find_last(); v != bitset::npos; v = R.find_prev(v)) {
            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m"; 
        }
        logger << std::endl;
    }
#endif

    // Now that we have our R, check if it is closed.
    // Simultaneously find lowest escape out of R (for the opponent)

    bool promoted = maybePromote(pr, pl, R, L);

    // if promoted, we don't need to consider the recursive game (according to the paper)
    if (promoted) return;

    // if (promoted) R.reset(); // alternative...

    /** /
    // optimization to not continue if we can be sure that the recursion already took all
    // possible opponent's small dominions
    //
    // sadly, this does not work well with the PP optimization
    L -= R;
    unsigned long count = L.count(); // what remains ?
    if (pl) {
        if (count <= (po/2)) return;
    } else {
        if (count <= (pe/2)) return;
    }
    // */

    // make a local copy of R, because R/L can be destroyed in the recursion
    bitset Z(R);

    // compute next vtop (for subgame) and the next priority
    int next_vtop = vtop;
    while (next_vtop >= 0 and (!G[next_vtop] or r[next_vtop] >= pr or u[next_vtop] >= pr)) next_vtop--;
    if (next_vtop == -1) return; // subgame is actually empty
    const int subpr = r[next_vtop];

    // run recursively
    solve(vtop, subpr, pr, pe, po);

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "back from recursive " << subpr << ", we are pr " << pr << ", pe=" << pe << ", po=" << po << std::endl;
    }
#endif

    // Now we must first perform Und
    // There may be a lower u. If same pl pr, then merge with our u. If different pl pr, reset.
    // There may be a lower r. If other pl, then merge to our u

    for (int v = vtop; v >= 0; v--) {
        if (u[v] != -1 and u[v] < pr) {
            // lower u
            if ((u[v]&1) == pl) {
                // same pl pr, so merge
                u[v] = pr;
            } else {
                // other pl pr, so reset
                u[v] = -1;
                r[v] = priority(v);
                str[v] = -1;
            }
        } else if ((subpr&1)!=pl and r[v] != -1 and r[v] < pr) {
            // it's a lower other pl r, merge to our u
            r[v] = -1;
            u[v] = pr;
        }
    }

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[1mstate after Und\033[m" << std::endl;
        for (auto v = G.find_last(); v != bitset::npos; v = G.find_prev(v)) {
            logger << label_vertex(v) << " r=" << r[v] << " u=" << u[v] << " str=" << label_vertex(str[v]) << std::endl;
        }
    }
#endif

    // after the recursion, R/U/L could be anything...
    // set R := all vertices with r[v] == pr
    // set U := all vertices with u[v] == pr
    // set L := all vertices with r[v] <= pr
    // also add each vertex in U to the attract queue Q

    R.reset();  
    L.reset();
    U.reset();
    for (int v = vtop; v >= 0; v--) {
        if (r[v] == pr) {
            R[v] = true; // add to R
        }
        if (r[v] != -1 && r[v] <= pr) {
            L[v] = true; // add to L
        }
        if (u[v] == pr) {
            U[v] = true; // add to U
            Q.push(v);   // add to Q for attracting from R/L to U
        }
    } 

    // Attract to U from L
    while (Q.nonempty()) {
        int v = Q.pop();
        u[v] = pr;
        r[v] = -1;
        attractVertices(1-pl, v, U, L, L);
    }

    // Update R and L
    R -= U;
    L -= U;

    // Add original R to current R in order to check if we need to reset R
    R |= Z;

    // check if we need to reset the region
    bool reset_R = false;
    for (auto v = R.find_first(); v != bitset::npos; v = R.find_next(v)) {
        // check if a vertex is now in a dominion or in u
        if (r[v] == -1) {
            reset_R = true; // either dominion or in u
            break;
        }
        // check if a vertex is in a higher opponent r
        if (r[v] > pr && (r[v]&1) != pl) {
            reset_R = true;
            break;
        }
        // check if a strategy leaves R
        if (str[v] != -1 && r[str[v]] != pr) {
            reset_R = true;
            break;
        }
    }

    if (reset_R) {
        // reset everything with r <= pr
        for (auto v = vtop; v >= 0; v--) {
            if (r[v] != -1 && r[v] <= pr) {
#ifndef NDEBUG
                if (trace >= 2) logger << "reset " << label_vertex(v) << std::endl;
#endif
                r[v] = priority(v);
                u[v] = -1;
                str[v] = -1;
            }
        }
    } else {
        // we did not reset, try to promote again
        maybePromote(pr, pl, R, L);
        // regardless of the outcome, if nothing reset, no need to go recursive again
        return;
    }

    // move vtop then expand right side of the universal tree
    while (vtop >= 0 and (!G[vtop] or r[vtop] > pr or u[vtop] > pr)) vtop--;
    if (vtop == -1) return; // and we're done, there's nothing left

    // Expand the right side of the current level of the universal tree
    if (pl == 0) solve(vtop, pr, prc, pe, po/2);
    else solve(vtop, pr, prc, pe/2, po);
}